

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.h
# Opt level: O2

void __thiscall
Symbol::Symbol(Symbol *this,string *name,vector<double,_std::allocator<double>_> *value,
              bool *is_assigned)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  this->type_ = kRealArray;
  (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)&this->ret_type_ = 0;
  *(undefined8 *)
   ((long)&(this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->is_assigned_ = true;
  std::vector<double,_std::allocator<double>_>::operator=(&(this->value_).real_array,value);
  return;
}

Assistant:

Symbol(const std::string &name, const std::vector<double> &value, const bool &is_assigned) :
            name_(name), type_(Symbol::Type::kRealArray), ret_type_(Symbol::Type::kNone), is_assigned_(true) {
        value_.real_array = value;
    }